

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_schema_common.c
# Opt level: O2

LY_ERR lysp_load_submodules(lysp_ctx *pctx,lysp_module *pmod,ly_set *new_mods)

{
  byte bVar1;
  ushort uVar2;
  ly_set *plVar3;
  lyd_node **pplVar4;
  lysp_submodule *plVar5;
  long lVar6;
  long lVar7;
  lyd_node *plVar8;
  undefined8 *puVar9;
  int iVar10;
  LY_ERR LVar11;
  ulong uVar12;
  long *plVar13;
  long lVar14;
  lyd_node_inner **pplVar15;
  char *pcVar16;
  char *pcVar17;
  ly_ctx *plVar18;
  ly_ctx *plVar19;
  lyd_node_inner *plVar20;
  lysp_include *plVar21;
  undefined8 *puVar22;
  ulong uVar23;
  long lVar24;
  ulong uVar25;
  lysp_revision *__s2;
  undefined8 uVar26;
  LYS_INFORMAT format;
  lysp_submodule *submod;
  lyd_node *local_a8;
  long *local_a0;
  ly_ctx *local_98;
  long local_90;
  ulong local_88;
  char *submodule_data;
  undefined8 *local_78;
  ly_set *local_70;
  ly_in *in;
  _func_void_void_ptr_void_ptr *submodule_data_free;
  lysp_load_module_check_data check_data;
  
  if (pctx == (lysp_ctx *)0x0) {
    local_98 = (ly_ctx *)0x0;
  }
  else {
    local_98 = (ly_ctx *)
               **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  uVar23 = 0;
  local_70 = new_mods;
LAB_0015cec9:
  plVar21 = pmod->includes;
  if (plVar21 == (lysp_include *)0x0) {
    uVar12 = 0;
  }
  else {
    uVar12 = *(ulong *)(plVar21[-1].rev + 8);
  }
  if (uVar12 <= uVar23) {
    return LY_SUCCESS;
  }
  submod = (lysp_submodule *)0x0;
  local_90 = uVar23 * 0x38;
  if (plVar21[uVar23].submodule == (lysp_submodule *)0x0) {
    plVar21 = plVar21 + uVar23;
    bVar1 = pmod->field_0x79;
    plVar3 = pctx->parsed_mods;
    local_88 = uVar23;
    if ((bVar1 & 2) == 0) {
      uVar12 = (ulong)(plVar3->count - 1);
    }
    else {
      uVar12 = (ulong)(plVar3->count - 1);
      local_a8 = (plVar3->field_2).dnodes[uVar12];
      local_78 = *(undefined8 **)local_a8;
      local_a0 = (long *)local_78[10];
      lVar6 = local_a0[3];
      uVar23 = 0xffffffffffffffff;
      __s2 = (lysp_revision *)(lVar6 + -0x10);
      do {
        pcVar17 = __s2->date;
        if (lVar6 == 0) {
          uVar25 = 0;
        }
        else {
          uVar25 = *(ulong *)(lVar6 + -8);
        }
        uVar23 = uVar23 + 1;
        if (uVar25 <= uVar23) {
          if ((char)local_a0[0xf] == '\x02') {
            if (pctx == (lysp_ctx *)0x0) {
              plVar18 = (ly_ctx *)0x0;
            }
            else {
              plVar18 = (ly_ctx *)*local_78;
            }
            ly_vlog(plVar18,(char *)0x0,LYVE_REFERENCE,
                    "YANG 1.1 requires all submodules to be included from main module. But submodule \"%s\" includes submodule \"%s\" which is not included by main module \"%s\"."
                    ,local_a8[2].parent,plVar21->name,*(undefined8 *)(*local_a0 + 8));
            return LY_EVALID;
          }
          goto LAB_0015cfd2;
        }
        pcVar16 = *(char **)(pcVar17 + 0x18);
        __s2 = (lysp_revision *)(pcVar17 + 0x38);
        iVar10 = strcmp(pcVar16,plVar21->name);
      } while (iVar10 != 0);
      if ((plVar21->rev[0] != '\0') &&
         (iVar10 = strncmp(plVar21->rev,(char *)__s2,0xb), iVar10 != 0)) {
        if (pctx == (lysp_ctx *)0x0) {
          plVar18 = (ly_ctx *)0x0;
        }
        else {
          plVar18 = (ly_ctx *)*local_78;
        }
        plVar20 = local_a8[2].parent;
        uVar26 = *(undefined8 *)(*local_a0 + 8);
LAB_0015d497:
        ly_vlog(plVar18,(char *)0x0,LYVE_REFERENCE,
                "Submodule %s includes different revision (%s) of the submodule %s:%s included by the main module %s."
                ,plVar20,plVar21->rev,pcVar16,__s2,uVar26);
        return LY_EVALID;
      }
      plVar5 = *(lysp_submodule **)(pcVar17 + 0x10);
      plVar21->submodule = plVar5;
      if (plVar5 != (lysp_submodule *)0x0) {
        return LY_SUCCESS;
      }
    }
LAB_0015cfd2:
    for (uVar25 = 0; uVar23 = local_88, plVar18 = local_98, uVar12 != uVar25; uVar25 = uVar25 + 1) {
      pplVar4 = (plVar3->field_2).dnodes;
      plVar5 = (lysp_submodule *)pplVar4[uVar25];
      if ((plVar5->field_0x79 & 2) != 0) {
        pcVar16 = plVar5->name;
        iVar10 = strcmp(pcVar16,plVar21->name);
        if (iVar10 == 0) {
          if (((plVar21->rev[0] == '\0') || (__s2 = plVar5->revs, __s2 == (lysp_revision *)0x0)) ||
             (iVar10 = strncmp(plVar21->rev,__s2->date,0xb), iVar10 == 0)) {
            plVar21->submodule = plVar5;
            return LY_SUCCESS;
          }
          plVar8 = pplVar4[uVar12];
          puVar9 = *(undefined8 **)plVar8;
          plVar20 = plVar8[2].parent;
          plVar18 = (ly_ctx *)*puVar9;
          uVar26 = puVar9[1];
          goto LAB_0015d497;
        }
      }
    }
    uVar2 = local_98->flags;
    if ((uVar2 & 0x20) != 0) goto LAB_0015d198;
    do {
      if (plVar18->imp_clb != (ly_module_imp_clb)0x0) {
        submodule_data = (char *)0x0;
        format = LYS_IN_UNKNOWN;
        submodule_data_free = (_func_void_void_ptr_void_ptr *)0x0;
        check_data.path = (char *)0x0;
        check_data.submoduleof = (char *)0x0;
        check_data.name = (char *)0x0;
        check_data.revision = (char *)0x0;
        pcVar17 = plVar21->rev;
        pcVar16 = pcVar17;
        if (plVar21->rev[0] == '\0') {
          pcVar16 = (char *)0x0;
        }
        LVar11 = (*plVar18->imp_clb)(*(char **)(*(long *)(pctx->parsed_mods->field_2).dnodes
                                                         [pctx->parsed_mods->count - 1] + 8),
                                     (char *)0x0,plVar21->name,pcVar16,plVar18->imp_clb_data,&format
                                     ,&submodule_data,&submodule_data_free);
        if (LVar11 == LY_SUCCESS) {
          LVar11 = ly_in_new_memory(submodule_data,&in);
          if (LVar11 != LY_SUCCESS) {
            return LVar11;
          }
          check_data.name = plVar21->name;
          if (plVar21->rev[0] == '\0') {
            pcVar17 = (char *)0x0;
          }
          check_data.submoduleof =
               *(char **)(*(long *)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1]
                         + 8);
          check_data.revision = pcVar17;
          lys_parse_submodule(plVar18,in,format,pctx->main_ctx,lysp_load_module_check,&check_data,
                              local_70,&submod);
          plVar21 = (lysp_include *)(pmod->includes->rev + local_90 + -0x28);
          ly_in_free(in,'\0');
          if (submodule_data_free != (_func_void_void_ptr_void_ptr *)0x0) {
            (*submodule_data_free)(submodule_data,plVar18->imp_clb_data);
          }
        }
      }
      if (submod != (lysp_submodule *)0x0) {
LAB_0015d1fd:
        if ((plVar21->rev[0] == '\0') && ((submod->field_0x79 & 0xc) == 4)) {
          submod->field_0x79 = submod->field_0x79 & 0xf3 | 8;
        }
        plVar21->submodule = submod;
        if ((bVar1 & 2) == 0) goto LAB_0015cef4;
        pcVar17 = pmod->includes->rev + local_90 + -0x28;
        puVar9 = *(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
        lVar6 = puVar9[10];
        lVar14 = *(long *)(lVar6 + 0x18);
        if (lVar14 != 0) {
          lVar7 = *(long *)(lVar14 + -8);
          lVar24 = lVar7 + 1;
          puVar9 = (undefined8 *)(lVar14 + 8);
          goto LAB_0015d26f;
        }
        plVar13 = (long *)malloc(0x40);
        if (plVar13 == (long *)0x0) {
          plVar18 = (ly_ctx *)*puVar9;
          goto LAB_0015d5c9;
        }
        *plVar13 = 1;
        lVar14 = 1;
        goto LAB_0015d312;
      }
      uVar2 = plVar18->flags;
      if ((uVar2 & 0x20) != 0) break;
LAB_0015d198:
      if ((uVar2 & 8) == 0) {
        pcVar17 = (char *)0x0;
        if (plVar21->rev[0] != '\0') {
          pcVar17 = plVar21->rev;
        }
        plVar3 = pctx->main_ctx->parsed_mods;
        lys_parse_localfile(plVar18,plVar21->name,pcVar17,pctx->main_ctx,
                            *(char **)(*(long *)(plVar3->field_2).dnodes[plVar3->count - 1] + 8),
                            '\x01',local_70,&submod);
        plVar21 = (lysp_include *)(pmod->includes->rev + local_90 + -0x28);
      }
      if (submod != (lysp_submodule *)0x0) goto LAB_0015d1fd;
    } while ((plVar18->flags & 0x20) != 0);
    goto LAB_0015d40a;
  }
  goto LAB_0015cef4;
LAB_0015d26f:
  puVar22 = puVar9;
  lVar24 = lVar24 + -1;
  if (lVar24 != 0) goto code_r0x0015d274;
  *(long *)(lVar14 + -8) = lVar7 + 1;
  plVar13 = (long *)realloc((long *)(lVar14 + -8),lVar7 * 0x38 + 0x40);
  if (plVar13 == (long *)0x0) {
    plVar13 = (long *)(*(long *)(lVar6 + 0x18) + -8);
    *plVar13 = *plVar13 + -1;
    if (pctx == (lysp_ctx *)0x0) {
      plVar18 = (ly_ctx *)0x0;
    }
    else {
      plVar18 = (ly_ctx *)
                **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
    }
LAB_0015d5c9:
    ly_log(plVar18,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","lysp_inject_submodule");
    return LY_EMEM;
  }
  lVar14 = *plVar13;
  plVar18 = local_98;
  uVar23 = local_88;
LAB_0015d312:
  *(long **)(lVar6 + 0x18) = plVar13 + 1;
  plVar13[lVar14 * 7 + -1] = 0;
  (plVar13 + lVar14 * 7 + -1)[1] = 0;
  plVar13[lVar14 * 7 + -3] = 0;
  (plVar13 + lVar14 * 7 + -3)[1] = 0;
  plVar13[lVar14 * 7 + -5] = 0;
  (plVar13 + lVar14 * 7 + -5)[1] = 0;
  plVar13[lVar14 * 7 + -6] = *(long *)pcVar17;
  if (pctx == (lysp_ctx *)0x0) {
    plVar19 = (ly_ctx *)0x0;
  }
  else {
    plVar19 = (ly_ctx *)
              **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  LVar11 = lydict_dup(plVar19,*(char **)(pcVar17 + 8),(char **)(plVar13 + lVar14 * 7 + -5));
  if (LVar11 != LY_SUCCESS) {
    return LVar11;
  }
  if (pctx == (lysp_ctx *)0x0) {
    plVar19 = (ly_ctx *)0x0;
  }
  else {
    plVar19 = (ly_ctx *)
              **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  LVar11 = lydict_dup(plVar19,*(char **)(pcVar17 + 0x10),(char **)(plVar13 + lVar14 * 7 + -4));
  if (LVar11 != LY_SUCCESS) {
    return LVar11;
  }
  if (pctx == (lysp_ctx *)0x0) {
    plVar19 = (ly_ctx *)0x0;
  }
  else {
    plVar19 = (ly_ctx *)
              **(undefined8 **)(pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
  }
  LVar11 = lydict_dup(plVar19,*(char **)(pcVar17 + 0x18),(char **)(plVar13 + lVar14 * 7 + -3));
  if (LVar11 != LY_SUCCESS) {
    return LVar11;
  }
  *(undefined4 *)((long)plVar13 + lVar14 * 0x38 + -1) = *(undefined4 *)(pcVar17 + 0x2f);
  plVar13[lVar14 * 7 + -1] = *(long *)(pcVar17 + 0x28);
  *(undefined1 *)((long)plVar13 + lVar14 * 0x38 + 3) = 1;
  goto LAB_0015d40a;
code_r0x0015d274:
  iVar10 = strcmp((char *)*puVar22,*(char **)(pcVar17 + 8));
  puVar9 = puVar22 + 7;
  if (iVar10 == 0) goto code_r0x0015d28c;
  goto LAB_0015d26f;
code_r0x0015d28c:
  puVar22[-1] = *(long *)pcVar17;
  plVar18 = local_98;
  uVar23 = local_88;
LAB_0015d40a:
  if (plVar21->submodule == (lysp_submodule *)0x0) {
    plVar8 = (pctx->parsed_mods->field_2).dnodes[pctx->parsed_mods->count - 1];
    if (((ulong)plVar8[2].schema & 0x200) == 0) {
      pplVar15 = (lyd_node_inner **)(*(long *)plVar8 + 8);
    }
    else {
      pplVar15 = &plVar8[2].parent;
    }
    ly_vlog(plVar18,(char *)0x0,LYVE_REFERENCE,"Including \"%s\" submodule into \"%s\" failed.",
            plVar21->name,*pplVar15);
    return LY_EVALID;
  }
LAB_0015cef4:
  uVar23 = uVar23 + 1;
  goto LAB_0015cec9;
}

Assistant:

LY_ERR
lysp_load_submodules(struct lysp_ctx *pctx, struct lysp_module *pmod, struct ly_set *new_mods)
{
    LY_ARRAY_COUNT_TYPE u;
    struct ly_ctx *ctx = PARSER_CTX(pctx);

    LY_ARRAY_FOR(pmod->includes, u) {
        LY_ERR ret = LY_SUCCESS, r;
        struct lysp_submodule *submod = NULL;
        struct lysp_include *inc = &pmod->includes[u];

        if (inc->submodule) {
            continue;
        }

        if (pmod->is_submod) {
            /* try to find the submodule in the main module or its submodules */
            ret = lysp_main_pmod_get_submodule(pctx, inc);
            LY_CHECK_RET(ret != LY_ENOT, ret);
        }

        /* try to use currently parsed submodule */
        r = lysp_parsed_mods_get_submodule(pctx, inc);
        LY_CHECK_RET(r != LY_ENOT, r);

        /* submodule not present in the main module, get the input data and parse it */
        if (!(ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
search_clb:
            if (ctx->imp_clb) {
                const char *submodule_data = NULL;
                LYS_INFORMAT format = LYS_IN_UNKNOWN;

                void (*submodule_data_free)(void *module_data, void *user_data) = NULL;
                struct lysp_load_module_check_data check_data = {0};
                struct ly_in *in;

                if (ctx->imp_clb(PARSER_CUR_PMOD(pctx)->mod->name, NULL, inc->name,
                        inc->rev[0] ? inc->rev : NULL, ctx->imp_clb_data,
                        &format, &submodule_data, &submodule_data_free) == LY_SUCCESS) {
                    LY_CHECK_RET(ly_in_new_memory(submodule_data, &in));
                    check_data.name = inc->name;
                    check_data.revision = inc->rev[0] ? inc->rev : NULL;
                    check_data.submoduleof = PARSER_CUR_PMOD(pctx)->mod->name;
                    lys_parse_submodule(ctx, in, format, pctx->main_ctx, lysp_load_module_check, &check_data, new_mods,
                            &submod);

                    /* update inc pointer - parsing another (YANG 1.0) submodule can cause injecting
                     * submodule's include into main module, where it is missing */
                    inc = &pmod->includes[u];

                    ly_in_free(in, 0);
                    if (submodule_data_free) {
                        submodule_data_free((void *)submodule_data, ctx->imp_clb_data);
                    }
                }
            }
            if (!submod && !(ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
                goto search_file;
            }
        } else {
search_file:
            if (!(ctx->flags & LY_CTX_DISABLE_SEARCHDIRS)) {
                /* submodule was not received from the callback or there is no callback set */
                lys_parse_localfile(ctx, inc->name, inc->rev[0] ? inc->rev : NULL, pctx->main_ctx,
                        PARSER_CUR_PMOD(pctx->main_ctx)->mod->name, 1, new_mods, (void **)&submod);

                /* update inc pointer - parsing another (YANG 1.0) submodule can cause injecting
                 * submodule's include into main module, where it is missing */
                inc = &pmod->includes[u];
            }
            if (!submod && (ctx->flags & LY_CTX_PREFER_SEARCHDIRS)) {
                goto search_clb;
            }
        }
        if (submod) {
            if (!inc->rev[0] && (submod->latest_revision == 1)) {
                /* update the latest_revision flag - here we have selected the latest available schema,
                 * consider that even the callback provides correct latest revision */
                submod->latest_revision = 2;
            }

            inc->submodule = submod;
            if (ret == LY_ENOT) {
                /* the submodule include is not present in YANG 1.0 main module - add it there */
                LY_CHECK_RET(lysp_inject_submodule(pctx, &pmod->includes[u]));
            }
        }
        if (!inc->submodule) {
            LOGVAL(ctx, LYVE_REFERENCE, "Including \"%s\" submodule into \"%s\" failed.", inc->name,
                    PARSER_CUR_PMOD(pctx)->is_submod ? ((struct lysp_submodule *)PARSER_CUR_PMOD(pctx))->name :
                    PARSER_CUR_PMOD(pctx)->mod->name);
            return LY_EVALID;
        }
    }

    return LY_SUCCESS;
}